

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flag.cc
# Opt level: O2

bool __thiscall
absl::lts_20240722::flags_internal::FlagImpl::RestoreState(FlagImpl *this,FlagState *flag_state)

{
  long lVar1;
  int64_t iVar2;
  byte bVar3;
  MutexLock l;
  
  l.mu_ = DataGuard(this);
  absl::lts_20240722::Mutex::Lock();
  lVar1 = flag_state->counter_;
  iVar2 = SequenceLock::ModificationCount(&this->seq_lock_);
  if (lVar1 != iVar2) {
    if ((this->field_0x28 & 4) == 0) {
      StoreValue(this,&flag_state->value_,kProgrammaticChange);
    }
    else {
      StoreValue(this,(flag_state->value_).heap_allocated,kProgrammaticChange);
    }
    bVar3 = this->field_0x29 & 0xfb | flag_state->modified_ << 2;
    this->field_0x29 = bVar3;
    this->field_0x29 = bVar3 & 0xf7 | flag_state->on_command_line_ << 3;
  }
  MutexLock::~MutexLock(&l);
  return lVar1 != iVar2;
}

Assistant:

bool FlagImpl::RestoreState(const FlagState& flag_state) {
  absl::MutexLock l(DataGuard());
  if (flag_state.counter_ == ModificationCount()) {
    return false;
  }

  switch (ValueStorageKind()) {
    case FlagValueStorageKind::kValueAndInitBit:
    case FlagValueStorageKind::kOneWordAtomic:
      StoreValue(&flag_state.value_.one_word, kProgrammaticChange);
      break;
    case FlagValueStorageKind::kSequenceLocked:
    case FlagValueStorageKind::kHeapAllocated:
      StoreValue(flag_state.value_.heap_allocated, kProgrammaticChange);
      break;
  }

  modified_ = flag_state.modified_;
  on_command_line_ = flag_state.on_command_line_;

  return true;
}